

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

int __thiscall QPDF::lengthNextN(QPDF *this,int first_object,int n)

{
  long lVar1;
  QPDFObjGen og_00;
  int iVar2;
  size_type sVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  qpdf_offset_t qVar6;
  int iVar7;
  bool bVar8;
  string_view msg;
  QPDFObjGen og;
  key_type local_a0;
  int local_94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar7 = 0;
  if (n < 1) {
    n = iVar7;
  }
  while( true ) {
    bVar8 = n == 0;
    n = n + -1;
    if (bVar8) break;
    local_a0.gen = 0;
    local_a0.obj = first_object;
    sVar3 = std::
            map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
            ::count(&((this->m)._M_t.
                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
                      .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                      super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->xref_table,
                    &local_a0);
    if (sVar3 == 0) {
      std::__cxx11::to_string(&local_70,first_object);
      std::operator+(&local_50,"no xref table entry for ",&local_70);
      std::operator+(&local_90,&local_50," 0");
      msg._M_str = local_90._M_dataplus._M_p;
      msg._M_len = local_90._M_string_length;
      linearizationWarning(this,msg);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
    else {
      local_94 = first_object;
      sVar4 = std::
              map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
              ::count(&((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->obj_cache,
                      &local_a0);
      if (sVar4 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,
                   "found unknown object while calculating length for linearization data",
                   (allocator<char> *)&local_50);
        stopOnError(this,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
      }
      pmVar5 = std::
               map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
               ::operator[](&((this->m)._M_t.
                              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                              .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                             obj_cache,&local_a0);
      lVar1 = pmVar5->end_after_space;
      og_00.gen = local_a0.gen;
      og_00.obj = local_a0.obj;
      qVar6 = getLinearizationOffset(this,og_00);
      local_90._M_dataplus._M_p = (pointer)(lVar1 - qVar6);
      iVar2 = QIntC::IntConverter<long_long,_int,_true,_true>::convert((longlong *)&local_90);
      iVar7 = iVar7 + iVar2;
      first_object = local_94;
    }
    first_object = first_object + 1;
  }
  return iVar7;
}

Assistant:

int
QPDF::lengthNextN(int first_object, int n)
{
    int length = 0;
    for (int i = 0; i < n; ++i) {
        QPDFObjGen og(first_object + i, 0);
        if (m->xref_table.count(og) == 0) {
            linearizationWarning(
                "no xref table entry for " + std::to_string(first_object + i) + " 0");
        } else {
            if (m->obj_cache.count(og) == 0) {
                stopOnError("found unknown object while calculating length for linearization data");
            }
            length += toI(m->obj_cache[og].end_after_space - getLinearizationOffset(og));
        }
    }
    return length;
}